

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteElemSegment(WatWriter *this,ElemSegment *segment)

{
  string_view str;
  bool bVar1;
  byte bVar2;
  ExprType EVar3;
  reference this_00;
  size_type sVar4;
  const_reference pvVar5;
  VarExpr<(wabt::ExprType)36> *pVVar6;
  ExprList *expr;
  const_iterator __end2;
  const_iterator __begin2;
  ExprListVector *__range2;
  uint8_t flags;
  ElemSegment *segment_local;
  WatWriter *this_local;
  
  WriteOpenSpace(this,"elem");
  bVar1 = Features::bulk_memory_enabled(&this->options_->features);
  if (bVar1) {
    str = (string_view)
          std::__cxx11::string::operator_cast_to_basic_string_view((string *)&segment->name);
    WriteNameOrIndex(this,str,this->elem_segment_index_,Space);
  }
  else {
    Writef(this,"(;%u;)",(ulong)this->elem_segment_index_);
  }
  bVar2 = ElemSegment::GetFlags(segment,(this->super_ModuleContext).module);
  if ((bVar2 & 3) == 2) {
    WriteOpenSpace(this,"table");
    WriteVar(this,&segment->table_var,Space);
    WriteCloseSpace(this);
  }
  if ((bVar2 & 1) == 0) {
    WriteInitExpr(this,&segment->offset);
  }
  if ((bVar2 & 3) == 3) {
    WritePuts(this,"declare",Space);
  }
  if ((bVar2 & 4) == 0) {
    bVar1 = wabt::operator==(segment->elem_type,FuncRef);
    if (!bVar1) {
      __assert_fail("segment.elem_type == Type::FuncRef",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wat-writer.cc"
                    ,0x62e,
                    "void wabt::(anonymous namespace)::WatWriter::WriteElemSegment(const ElemSegment &)"
                   );
    }
    WritePuts(this,"func",Space);
  }
  else {
    WriteType(this,segment->elem_type,Space);
  }
  __end2 = std::
           vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
           ::begin(&segment->elem_exprs);
  expr = (ExprList *)
         std::
         vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
         ::end(&segment->elem_exprs);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_wabt::intrusive_list<wabt::Expr>_*,_std::vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>_>
                                *)&expr);
    if (!bVar1) {
      WriteCloseNewline(this);
      this->elem_segment_index_ = this->elem_segment_index_ + 1;
      return;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<const_wabt::intrusive_list<wabt::Expr>_*,_std::vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>_>
              ::operator*(&__end2);
    if ((bVar2 & 4) == 0) {
      sVar4 = intrusive_list<wabt::Expr>::size(this_00);
      if (sVar4 != 1) {
        __assert_fail("expr.size() == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wat-writer.cc"
                      ,0x636,
                      "void wabt::(anonymous namespace)::WatWriter::WriteElemSegment(const ElemSegment &)"
                     );
      }
      pvVar5 = intrusive_list<wabt::Expr>::front(this_00);
      EVar3 = Expr::type(pvVar5);
      if (EVar3 != RefFunc) {
        __assert_fail("expr.front().type() == ExprType::RefFunc",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wat-writer.cc"
                      ,0x637,
                      "void wabt::(anonymous namespace)::WatWriter::WriteElemSegment(const ElemSegment &)"
                     );
      }
      pvVar5 = intrusive_list<wabt::Expr>::front(this_00);
      pVVar6 = cast<wabt::VarExpr<(wabt::ExprType)36>const,wabt::Expr>(pvVar5);
      WriteVar(this,&pVVar6->var,Space);
    }
    else {
      WriteInitExpr(this,this_00);
    }
    __gnu_cxx::
    __normal_iterator<const_wabt::intrusive_list<wabt::Expr>_*,_std::vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

void WatWriter::WriteElemSegment(const ElemSegment& segment) {
  WriteOpenSpace("elem");
  // The first name we encounter here, pre-bulk-memory, was intended to refer to
  // the table while segment names were not supported at all.  For this reason
  // we cannot emit a segment name here without bulk-memory enabled, otherwise
  // the name will be assumed to be the name of a table and parsing will fail.
  if (options_.features.bulk_memory_enabled()) {
    WriteNameOrIndex(segment.name, elem_segment_index_, NextChar::Space);
  } else {
    Writef("(;%u;)", elem_segment_index_);
  }

  uint8_t flags = segment.GetFlags(&module);

  if ((flags & (SegPassive | SegExplicitIndex)) == SegExplicitIndex) {
    WriteOpenSpace("table");
    WriteVar(segment.table_var, NextChar::Space);
    WriteCloseSpace();
  }

  if (!(flags & SegPassive)) {
    WriteInitExpr(segment.offset);
  }

  if ((flags & SegDeclared) == SegDeclared) {
    WritePuts("declare", NextChar::Space);
  }

  if (flags & SegUseElemExprs) {
    WriteType(segment.elem_type, NextChar::Space);
  } else {
    assert(segment.elem_type == Type::FuncRef);
    WritePuts("func", NextChar::Space);
  }

  for (const ExprList& expr : segment.elem_exprs) {
    if (flags & SegUseElemExprs) {
      WriteInitExpr(expr);
    } else {
      assert(expr.size() == 1);
      assert(expr.front().type() == ExprType::RefFunc);
      WriteVar(cast<const RefFuncExpr>(&expr.front())->var, NextChar::Space);
    }
  }
  WriteCloseNewline();
  elem_segment_index_++;
}